

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::handleEncryptedRegion
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *skippedTokens,bool isSingleLine)

{
  SourceLocation location;
  Token directive;
  byte bVar1;
  SourceLocation this_00;
  Info *in_RCX;
  SmallVectorBase<slang::parsing::Token> *in_RDX;
  Token *in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  Token TVar2;
  Token token;
  undefined8 in_stack_ffffffffffffff90;
  undefined2 uVar3;
  uint32_t in_stack_ffffffffffffff98;
  ProtectEncoding in_stack_ffffffffffffff9c;
  undefined4 uVar4;
  Lexer *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffd0;
  DiagCode code;
  
  uVar3 = (undefined2)((ulong)in_stack_ffffffffffffff90 >> 0x30);
  bVar1 = in_R9B & 1;
  TVar2.info = in_RCX;
  TVar2._0_8_ = in_R8;
  ensureNoPragmaArgs((Preprocessor *)
                     (CONCAT17(in_R9B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),TVar2,
                     (PragmaExpressionSyntax *)in_RDX);
  directive.info = in_RCX;
  directive.kind = (short)in_R8;
  directive._2_1_ = (char)((ulong)in_R8 >> 0x10);
  directive.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  directive.rawLen = (int)((ulong)in_R8 >> 0x20);
  skipMacroTokensBeforeProtectRegion
            ((Preprocessor *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),directive,in_RDX);
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  ::back((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
          *)&in_RDI[0xf].info);
  std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::operator->
            ((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
             0x3911fb);
  TVar2 = Lexer::lexEncodedText
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                     SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  code = (DiagCode)TVar2.rawLen;
  uVar4 = 0x280004;
  this_00 = Token::location((Token *)&stack0xffffffffffffffa0);
  location._4_4_ = uVar4;
  location._0_4_ = in_stack_ffffffffffffff98;
  addDiag((Preprocessor *)this_00,code,location);
  SmallVectorBase<slang::parsing::Token>::push_back
            ((SmallVectorBase<slang::parsing::Token> *)this_00,in_RDI);
  return;
}

Assistant:

void Preprocessor::handleEncryptedRegion(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>& skippedTokens, bool isSingleLine) {
    ensureNoPragmaArgs(keyword, args);
    skipMacroTokensBeforeProtectRegion(keyword, skippedTokens);

    Token token = lexerStack.back()->lexEncodedText(protectEncoding, protectBytes, isSingleLine,
                                                    /* legacyProtectedMode */ false);
    addDiag(diag::ProtectedEnvelope, token.location());

    skippedTokens.push_back(token);
}